

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O0

void free_erased(vmd_bst_t *tree,vmd_bst_rev_t *rev)

{
  void *pvVar1;
  int local_1c;
  int i;
  vmd_bst_rev_t *rev_local;
  vmd_bst_t *tree_local;
  
  if (rev->erased != (vmd_bst_node_t **)0x0) {
    if (rev->erased_data == (void *)0x0) {
      pvVar1 = malloc(tree->csize * (long)rev->erased_count);
      rev->erased_data = pvVar1;
      for (local_1c = 0; local_1c < rev->erased_count; local_1c = local_1c + 1) {
        memcpy((void *)((long)rev->erased_data + (long)local_1c * tree->csize),
               &rev->erased[local_1c]->field_0x21,tree->csize);
      }
    }
    for (local_1c = 0; local_1c < rev->erased_count; local_1c = local_1c + 1) {
      dlist_insert(&tree->free,rev->erased[local_1c]);
    }
  }
  return;
}

Assistant:

static void
free_erased(bst_t *tree, bst_rev_t *rev)
{
	int i;
	if (rev->erased == NULL)
		return;

	if (rev->erased_data == NULL) {
		rev->erased_data = malloc(tree->csize * rev->erased_count);
		for (i = 0; i < rev->erased_count; i++)
			memcpy(rev->erased_data + i * tree->csize, rev->erased[i]->data, tree->csize);
	}

	for (i = 0; i < rev->erased_count; i++)
		dlist_insert(&tree->free, rev->erased[i]);
}